

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int xar_bid(archive_read *a,int best_bid)

{
  uint16_t uVar1;
  uint32_t uVar2;
  void *pp;
  int bid;
  uchar *b;
  int best_bid_local;
  archive_read *a_local;
  
  pp = __archive_read_ahead(a,0x1c,(ssize_t *)0x0);
  if (pp == (void *)0x0) {
    a_local._4_4_ = -1;
  }
  else {
    uVar2 = archive_be32dec(pp);
    if (uVar2 == 0x78617221) {
      uVar1 = archive_be16dec((void *)((long)pp + 4));
      if (uVar1 == 0x1c) {
        uVar1 = archive_be16dec((void *)((long)pp + 6));
        if (uVar1 == 1) {
          uVar2 = archive_be32dec((void *)((long)pp + 0x18));
          if (uVar2 < 3) {
            a_local._4_4_ = 0x60;
          }
          else {
            a_local._4_4_ = 0;
          }
        }
        else {
          a_local._4_4_ = 0;
        }
      }
      else {
        a_local._4_4_ = 0;
      }
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
xar_bid(struct archive_read *a, int best_bid)
{
	const unsigned char *b;
	int bid;

	(void)best_bid; /* UNUSED */

	b = __archive_read_ahead(a, HEADER_SIZE, NULL);
	if (b == NULL)
		return (-1);

	bid = 0;
	/*
	 * Verify magic code
	 */
	if (archive_be32dec(b) != HEADER_MAGIC)
		return (0);
	bid += 32;
	/*
	 * Verify header size
	 */
	if (archive_be16dec(b+4) != HEADER_SIZE)
		return (0);
	bid += 16;
	/*
	 * Verify header version
	 */
	if (archive_be16dec(b+6) != HEADER_VERSION)
		return (0);
	bid += 16;
	/*
	 * Verify type of checksum
	 */
	switch (archive_be32dec(b+24)) {
	case CKSUM_NONE:
	case CKSUM_SHA1:
	case CKSUM_MD5:
		bid += 32;
		break;
	default:
		return (0);
	}

	return (bid);
}